

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

ImGuiDockNode * ImGui::DockContextAddNode(ImGuiContext *ctx,ImGuiID id)

{
  int *piVar1;
  ImGuiDockContext *this;
  void *pvVar2;
  ImGuiDockNode *val;
  
  if (id == 0) {
    this = ctx->DockContext;
    id = 0;
    do {
      id = id + 1;
      pvVar2 = ImGuiStorage::GetVoidPtr(&this->Nodes,id);
    } while (pvVar2 != (void *)0x0);
  }
  if (GImGui != (ImGuiContext *)0x0) {
    piVar1 = &(GImGui->IO).MetricsActiveAllocations;
    *piVar1 = *piVar1 + 1;
  }
  val = (ImGuiDockNode *)(*GImAllocatorAllocFunc)(0xb8,GImAllocatorUserData);
  (val->Windows).Size = 0;
  (val->Windows).Capacity = 0;
  (val->Windows).Data = (ImGuiWindow **)0x0;
  (val->WindowClass).ClassId = 0;
  (val->WindowClass).ParentViewportId = 0;
  (val->WindowClass).ViewportFlagsOverrideSet = 0;
  (val->WindowClass).ViewportFlagsOverrideClear = 0;
  (val->WindowClass).DockingAlwaysTabBar = false;
  (val->WindowClass).DockingAllowUnclassed = true;
  (val->Pos).x = 0.0;
  (val->Pos).y = 0.0;
  (val->Size).x = 0.0;
  (val->Size).y = 0.0;
  (val->SizeRef).x = 0.0;
  (val->SizeRef).y = 0.0;
  val->ID = id;
  val->SharedFlags = 0;
  val->LocalFlags = 0;
  val->TabBar = (ImGuiTabBar *)0x0;
  val->ParentNode = (ImGuiDockNode *)0x0;
  val->ChildNodes[0] = (ImGuiDockNode *)0x0;
  val->ChildNodes[1] = (ImGuiDockNode *)0x0;
  val->SplitAxis = -1;
  val->State = ImGuiDockNodeState_Unknown;
  val->HostWindow = (ImGuiWindow *)0x0;
  val->VisibleWindow = (ImGuiWindow *)0x0;
  val->CentralNode = (ImGuiDockNode *)0x0;
  val->OnlyNodeWithWindows = (ImGuiDockNode *)0x0;
  val->LastFrameAlive = -1;
  val->LastFrameActive = -1;
  val->LastFrameFocused = -1;
  val->LastFocusedNodeID = 0;
  val->SelectedTabID = 0;
  val->WantCloseTabID = 0;
  *(undefined2 *)&val->field_0xb0 = 0x209;
  val->field_0xb2 = val->field_0xb2 & 0xf0;
  ImGuiStorage::SetVoidPtr(&ctx->DockContext->Nodes,id,val);
  return val;
}

Assistant:

static ImGuiDockNode* ImGui::DockContextAddNode(ImGuiContext* ctx, ImGuiID id)
{
    // Generate an ID for the new node (the exact ID value doesn't matter as long as it is not already used) and add the first window.
    if (id == 0)
        id = DockContextGenNodeID(ctx);
    else
        IM_ASSERT(DockContextFindNodeByID(ctx, id) == NULL);

    // We don't set node->LastFrameAlive on construction. Nodes are always created at all time to reflect .ini settings!
    IMGUI_DEBUG_LOG_DOCKING("DockContextAddNode 0x%08X\n", id);
    ImGuiDockNode* node = IM_NEW(ImGuiDockNode)(id);
    ctx->DockContext->Nodes.SetVoidPtr(node->ID, node);
    return node;
}